

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

int Cnf_SopCountLiterals(char *pSop,int nCubes)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  if (0 < nCubes) {
    uVar2 = 0;
    iVar1 = 0;
    do {
      iVar4 = 4;
      iVar3 = (int)pSop[uVar2];
      do {
        iVar1 = iVar1 + (uint)(iVar3 % 3 != 2);
        iVar4 = iVar4 + -1;
        iVar3 = iVar3 / 3;
      } while (iVar4 != 0);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)nCubes);
    return iVar1;
  }
  return 0;
}

Assistant:

int Cnf_SopCountLiterals( char * pSop, int nCubes )
{
    int nLits = 0, Cube, i, b;
    for ( i = 0; i < nCubes; i++ )
    {
        Cube = pSop[i];
        for ( b = 0; b < 4; b++ )
        {
            if ( Cube % 3 != 2 )
                nLits++;
            Cube = Cube / 3;
        }
    }
    return nLits;
}